

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool ScanValueString(ConfigScanner *sc)

{
  char cVar1;
  char *pcVar2;
  long in_RDI;
  char *value;
  char ch;
  undefined7 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var3;
  
  if (in_RDI == 0) {
    _Var3 = false;
  }
  else {
    cVar1 = **(char **)(in_RDI + 0x18);
    if (cVar1 == '\"') {
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
      pcVar2 = GetQuote(sc);
      if (pcVar2 == (char *)0x0) {
        return false;
      }
      *(char **)(in_RDI + 0x58) = pcVar2;
      *(undefined4 *)(in_RDI + 0x38) = 1;
    }
    else if ((cVar1 == 't') || (cVar1 == 'f')) {
      _Var3 = ScanBoolean((ConfigScanner *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      if (!_Var3) {
        return false;
      }
    }
    else if ((((cVar1 == '+') || (cVar1 == '-')) || (('/' < cVar1 && (cVar1 < ':')))) &&
            (_Var3 = ScanNumber((ConfigScanner *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
            !_Var3)) {
      return false;
    }
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool ScanValueString(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	if (ch == '"')
	{
		sc->ptr++;
		char *value = GetQuote(sc);
		if (value == NULL)
		{
			return false;
		}
		sc->current_string = value;
		sc->vtype = VTYPE_STRING;
	}
	else if (ch == 't' || ch == 'f')
	{
		if (!ScanBoolean(sc))
		{
			return false;
		}
	}
	else if (ch == '+' || ch == '-' || (ch >= '0' && ch <= '9'))
	{
		if (!ScanNumber(sc))
		{
			return false;
		}
	}
	return true;
}